

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::
Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
::Maybe(Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
        *this,Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
              *other)

{
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pMVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  byte bVar4;
  
  bVar4 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar4;
  if ((bool)bVar4 == true) {
    (this->ptr).field_1.value.value.ptr = (other->ptr).field_1.value.value.ptr;
    (this->ptr).field_1.value.value.size_ = (other->ptr).field_1.value.value.size_;
    (this->ptr).field_1.value.value.disposer = (other->ptr).field_1.value.value.disposer;
    (other->ptr).field_1.value.value.ptr =
         (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
    (other->ptr).field_1.value.value.size_ = 0;
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x18) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x18);
    bVar4 = (other->ptr).isSet;
  }
  if ((bVar4 & 1) != 0) {
    (other->ptr).isSet = false;
    pMVar1 = (other->ptr).field_1.value.value.ptr;
    if (pMVar1 != (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)
                  0x0) {
      sVar2 = (other->ptr).field_1.value.value.size_;
      (other->ptr).field_1.value.value.ptr =
           (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
      (other->ptr).field_1.value.value.size_ = 0;
      pAVar3 = (other->ptr).field_1.value.value.disposer;
      (**pAVar3->_vptr_ArrayDisposer)
                (pAVar3,pMVar1,0x20,sVar2,sVar2,
                 ArrayDisposer::
                 Dispose_<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
                 ::destruct);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }